

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVector.h
# Opt level: O2

void __thiscall
JointPolicyPureVector::JointPolicyPureVector
          (JointPolicyPureVector *this,I_PtPDpure_constPtr *pu,PolicyDomainCategory idc)

{
  JointPolicyDiscretePure::JointPolicyDiscretePure
            ((JointPolicyDiscretePure *)this,(shared_ptr *)pu,idc);
  JPolComponent_VectorImplementation::JPolComponent_VectorImplementation
            ((JPolComponent_VectorImplementation *)(this + 0x38),(shared_ptr *)pu,idc,999999);
  *(undefined **)this = &JointPolicyDiscretePure::typeinfo;
  *(code **)(this + 0x38) = GMAA_MAAstarClassic::GMAA_MAAstarClassic;
  *(undefined8 *)(this + 0x90) = 0;
  *(undefined8 *)(this + 0x80) = 0;
  *(undefined8 *)(this + 0x88) = 0;
  return;
}

Assistant:

JointPolicyPureVector(I_PtPDpure_constPtr pu,
                              PolicyGlobals::PolicyDomainCategory idc )
            :
            JointPolicyDiscretePure(pu, idc),
            JPolComponent_VectorImplementation(pu, idc)
        {}